

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.h
# Opt level: O2

void __thiscall Assimp::IFC::ConversionData::~ConversionData(ConversionData *this)

{
  std::
  for_each<__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>,Assimp::IFC::delete_fun<aiMesh>>
            ((this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::
  for_each<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,Assimp::IFC::delete_fun<aiMaterial>>
            ((this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&(this->already_processed)._M_t);
  std::
  _Rb_tree<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*,_std::pair<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*const,_unsigned_int>,_std::_Select1st<std::pair<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*const,_unsigned_int>_>,_std::less<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*>,_std::allocator<std::pair<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*const,_unsigned_int>_>_>
  ::~_Rb_tree(&(this->cached_materials)._M_t);
  std::
  _Rb_tree<Assimp::IFC::ConversionData::MeshCacheIndex,_std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<Assimp::IFC::ConversionData::MeshCacheIndex>,_std::allocator<std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::~_Rb_tree(&(this->cached_meshes)._M_t);
  std::_Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~_Vector_base
            (&(this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>);
  std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
            (&(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
  return;
}

Assistant:

~ConversionData() {
        std::for_each(meshes.begin(),meshes.end(),delete_fun<aiMesh>());
        std::for_each(materials.begin(),materials.end(),delete_fun<aiMaterial>());
    }